

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

bool __thiscall
google::protobuf::DescriptorProto::MergePartialFromCodedStream
          (DescriptorProto *this,CodedInputStream *input)

{
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  ArenaStringPtr *this_01;
  byte bVar1;
  int iVar2;
  byte *pbVar3;
  void *pvVar4;
  uint8 *puVar5;
  Arena *this_02;
  char *data;
  bool bVar6;
  int length;
  uint32 uVar7;
  int iVar8;
  Type *this_03;
  Type *this_04;
  Type *this_05;
  Type *this_06;
  Type *this_07;
  MessageOptions *this_08;
  Type *this_09;
  pair<int,_int> pVar9;
  string *psVar10;
  Type *pTVar11;
  UnknownFieldSet *unknown_fields;
  RepeatedPtrFieldBase *this_10;
  char cVar12;
  uint tag;
  ulong uVar13;
  Rep *pRVar14;
  
  this_00 = &this->reserved_name_;
  this_01 = &this->name_;
LAB_002f9348:
  do {
    pbVar3 = input->buffer_;
    uVar7 = 0;
    if (pbVar3 < input->buffer_end_) {
      bVar1 = *pbVar3;
      uVar7 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_002f936c;
      input->buffer_ = pbVar3 + 1;
      uVar13 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_002f936c:
      uVar7 = io::CodedInputStream::ReadTagFallback(input,uVar7);
      uVar13 = 0;
      if (uVar7 - 1 < 0x7f) {
        uVar13 = 0x100000000;
      }
      uVar13 = uVar7 | uVar13;
    }
    tag = (uint)uVar13;
    if ((uVar13 & 0x100000000) == 0) goto switchD_002f93e8_default;
    cVar12 = (char)uVar13;
    switch((uint)(uVar13 >> 3) & 0x1fffffff) {
    case 1:
      if (cVar12 == '\n') {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
        psVar10 = (this->name_).ptr_;
        if (psVar10 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
          internal::ArenaStringPtr::CreateInstanceNoArena
                    (this_01,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
          psVar10 = this_01->ptr_;
        }
        bVar6 = internal::WireFormatLite::ReadBytes(input,psVar10);
        if (!bVar6) {
          return false;
        }
        internal::WireFormatLite::VerifyUtf8String
                  ((this_01->ptr_->_M_dataplus)._M_p,(int)this_01->ptr_->_M_string_length,PARSE,
                   "google.protobuf.DescriptorProto.name");
        goto LAB_002f9348;
      }
      break;
    case 2:
      this_10 = &(this->field_).super_RepeatedPtrFieldBase;
      if (cVar12 != '\x12') break;
LAB_002f95a3:
      this_07 = internal::RepeatedPtrFieldBase::
                Add<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                          (this_10,(Type *)0x0);
      puVar5 = input->buffer_;
      if ((puVar5 < input->buffer_end_) && (iVar8 = (int)(char)*puVar5, -1 < iVar8)) {
        input->buffer_ = puVar5 + 1;
      }
      else {
        iVar8 = io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        if (iVar8 < 0) {
          return false;
        }
      }
      pVar9 = io::CodedInputStream::IncrementRecursionDepthAndPushLimit(input,iVar8);
      if ((long)pVar9 < 0) {
        return false;
      }
      bVar6 = FieldDescriptorProto::MergePartialFromCodedStream(this_07,input);
LAB_002f97d5:
      if (bVar6 == false) {
        return false;
      }
      bVar6 = io::CodedInputStream::DecrementRecursionDepthAndPopLimit(input,pVar9.first);
      goto joined_r0x002f97ef;
    case 3:
      if (cVar12 == '\x1a') {
        this_04 = internal::RepeatedPtrFieldBase::
                  Add<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>::TypeHandler>
                            (&(this->nested_type_).super_RepeatedPtrFieldBase,(Type *)0x0);
        puVar5 = input->buffer_;
        if ((puVar5 < input->buffer_end_) && (iVar8 = (int)(char)*puVar5, -1 < iVar8)) {
          input->buffer_ = puVar5 + 1;
        }
        else {
          iVar8 = io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
          if (iVar8 < 0) {
            return false;
          }
        }
        pVar9 = io::CodedInputStream::IncrementRecursionDepthAndPushLimit(input,iVar8);
        if ((long)pVar9 < 0) {
          return false;
        }
        bVar6 = MergePartialFromCodedStream(this_04,input);
        goto LAB_002f97d5;
      }
      break;
    case 4:
      if (cVar12 == '\"') {
        this_05 = internal::RepeatedPtrFieldBase::
                  Add<google::protobuf::RepeatedPtrField<google::protobuf::EnumDescriptorProto>::TypeHandler>
                            (&(this->enum_type_).super_RepeatedPtrFieldBase,(Type *)0x0);
        puVar5 = input->buffer_;
        if ((puVar5 < input->buffer_end_) && (iVar8 = (int)(char)*puVar5, -1 < iVar8)) {
          input->buffer_ = puVar5 + 1;
        }
        else {
          iVar8 = io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
          if (iVar8 < 0) {
            return false;
          }
        }
        pVar9 = io::CodedInputStream::IncrementRecursionDepthAndPushLimit(input,iVar8);
        if ((long)pVar9 < 0) {
          return false;
        }
        bVar6 = EnumDescriptorProto::MergePartialFromCodedStream(this_05,input);
        goto LAB_002f97d5;
      }
      break;
    case 5:
      if (cVar12 == '*') {
        this_03 = internal::RepeatedPtrFieldBase::
                  Add<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto_ExtensionRange>::TypeHandler>
                            (&(this->extension_range_).super_RepeatedPtrFieldBase,(Type *)0x0);
        puVar5 = input->buffer_;
        if ((puVar5 < input->buffer_end_) && (iVar8 = (int)(char)*puVar5, -1 < iVar8)) {
          input->buffer_ = puVar5 + 1;
        }
        else {
          iVar8 = io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
          if (iVar8 < 0) {
            return false;
          }
        }
        pVar9 = io::CodedInputStream::IncrementRecursionDepthAndPushLimit(input,iVar8);
        if ((long)pVar9 < 0) {
          return false;
        }
        bVar6 = DescriptorProto_ExtensionRange::MergePartialFromCodedStream(this_03,input);
        goto LAB_002f97d5;
      }
      break;
    case 6:
      this_10 = &(this->extension_).super_RepeatedPtrFieldBase;
      if (cVar12 == '2') goto LAB_002f95a3;
      break;
    case 7:
      if (cVar12 == ':') {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
        this_08 = this->options_;
        if (this_08 == (MessageOptions *)0x0) {
          this_08 = (MessageOptions *)operator_new(0x70);
          MessageOptions::MessageOptions(this_08);
          this->options_ = this_08;
        }
        puVar5 = input->buffer_;
        if ((puVar5 < input->buffer_end_) && (iVar8 = (int)(char)*puVar5, -1 < iVar8)) {
          input->buffer_ = puVar5 + 1;
        }
        else {
          iVar8 = io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
          if (iVar8 < 0) {
            return false;
          }
        }
        pVar9 = io::CodedInputStream::IncrementRecursionDepthAndPushLimit(input,iVar8);
        if ((long)pVar9 < 0) {
          return false;
        }
        bVar6 = MessageOptions::MergePartialFromCodedStream(this_08,input);
        goto LAB_002f97d5;
      }
      break;
    case 8:
      if (cVar12 == 'B') {
        this_06 = internal::RepeatedPtrFieldBase::
                  Add<google::protobuf::RepeatedPtrField<google::protobuf::OneofDescriptorProto>::TypeHandler>
                            (&(this->oneof_decl_).super_RepeatedPtrFieldBase,(Type *)0x0);
        puVar5 = input->buffer_;
        if ((puVar5 < input->buffer_end_) && (iVar8 = (int)(char)*puVar5, -1 < iVar8)) {
          input->buffer_ = puVar5 + 1;
        }
        else {
          iVar8 = io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
          if (iVar8 < 0) {
            return false;
          }
        }
        pVar9 = io::CodedInputStream::IncrementRecursionDepthAndPushLimit(input,iVar8);
        if ((long)pVar9 < 0) {
          return false;
        }
        bVar6 = OneofDescriptorProto::MergePartialFromCodedStream(this_06,input);
        goto LAB_002f97d5;
      }
      break;
    case 9:
      if (cVar12 == 'J') {
        this_09 = internal::RepeatedPtrFieldBase::
                  Add<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto_ReservedRange>::TypeHandler>
                            (&(this->reserved_range_).super_RepeatedPtrFieldBase,(Type *)0x0);
        puVar5 = input->buffer_;
        if ((puVar5 < input->buffer_end_) && (iVar8 = (int)(char)*puVar5, -1 < iVar8)) {
          input->buffer_ = puVar5 + 1;
        }
        else {
          iVar8 = io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
          if (iVar8 < 0) {
            return false;
          }
        }
        pVar9 = io::CodedInputStream::IncrementRecursionDepthAndPushLimit(input,iVar8);
        if ((long)pVar9 < 0) {
          return false;
        }
        bVar6 = DescriptorProto_ReservedRange::MergePartialFromCodedStream(this_09,input);
        goto LAB_002f97d5;
      }
      break;
    case 10:
      if (cVar12 == 'R') {
        pRVar14 = (this->reserved_name_).super_RepeatedPtrFieldBase.rep_;
        if (pRVar14 == (Rep *)0x0) {
          iVar8 = (this->reserved_name_).super_RepeatedPtrFieldBase.total_size_;
LAB_002f980e:
          internal::RepeatedPtrFieldBase::Reserve(&this_00->super_RepeatedPtrFieldBase,iVar8 + 1);
          pRVar14 = (this->reserved_name_).super_RepeatedPtrFieldBase.rep_;
          iVar8 = pRVar14->allocated_size;
LAB_002f9823:
          pRVar14->allocated_size = iVar8 + 1;
          this_02 = (this_00->super_RepeatedPtrFieldBase).arena_;
          if (this_02 == (Arena *)0x0) {
            psVar10 = (string *)operator_new(0x20);
            (psVar10->_M_dataplus)._M_p = (pointer)&psVar10->field_2;
            psVar10->_M_string_length = 0;
            (psVar10->field_2)._M_local_buf[0] = '\0';
          }
          else {
            psVar10 = (string *)
                      Arena::AllocateAligned
                                (this_02,(type_info *)&std::__cxx11::string::typeinfo,0x20);
            (psVar10->_M_dataplus)._M_p = (pointer)&psVar10->field_2;
            psVar10->_M_string_length = 0;
            (psVar10->field_2)._M_local_buf[0] = '\0';
            Arena::AddListNode(this_02,psVar10,internal::arena_destruct_object<std::__cxx11::string>
                              );
            pRVar14 = (this->reserved_name_).super_RepeatedPtrFieldBase.rep_;
          }
          iVar8 = (this->reserved_name_).super_RepeatedPtrFieldBase.current_size_;
          (this->reserved_name_).super_RepeatedPtrFieldBase.current_size_ = iVar8 + 1;
          pRVar14->elements[iVar8] = psVar10;
        }
        else {
          iVar2 = (this->reserved_name_).super_RepeatedPtrFieldBase.current_size_;
          iVar8 = pRVar14->allocated_size;
          if (iVar8 <= iVar2) {
            if (iVar8 == (this->reserved_name_).super_RepeatedPtrFieldBase.total_size_)
            goto LAB_002f980e;
            goto LAB_002f9823;
          }
          (this->reserved_name_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
          psVar10 = (string *)pRVar14->elements[iVar2];
        }
        bVar6 = internal::WireFormatLite::ReadBytes(input,psVar10);
        if (!bVar6) {
          return false;
        }
        pTVar11 = internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                            (&this_00->super_RepeatedPtrFieldBase,
                             (this->reserved_name_).super_RepeatedPtrFieldBase.current_size_ + -1);
        data = (pTVar11->_M_dataplus)._M_p;
        pTVar11 = internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                            (&this_00->super_RepeatedPtrFieldBase,
                             (this->reserved_name_).super_RepeatedPtrFieldBase.current_size_ + -1);
        internal::WireFormatLite::VerifyUtf8String
                  (data,(int)pTVar11->_M_string_length,PARSE,
                   "google.protobuf.DescriptorProto.reserved_name");
        goto LAB_002f9348;
      }
    }
switchD_002f93e8_default:
    if (tag == 0) {
      return true;
    }
    if ((tag & 7) == 4) {
      return true;
    }
    pvVar4 = (this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_;
    if (((ulong)pvVar4 & 1) == 0) {
      unknown_fields =
           internal::
           InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           ::mutable_unknown_fields_slow
                     (&(this->_internal_metadata_).
                       super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                     );
    }
    else {
      unknown_fields = (UnknownFieldSet *)((ulong)pvVar4 & 0xfffffffffffffffe);
    }
    bVar6 = internal::WireFormat::SkipField(input,tag,unknown_fields);
joined_r0x002f97ef:
    if (!bVar6) {
      return false;
    }
  } while( true );
}

Assistant:

bool DescriptorProto::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:google.protobuf.DescriptorProto)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional string name = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_name()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->name().data(), this->name().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "google.protobuf.DescriptorProto.name");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .google.protobuf.FieldDescriptorProto field = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(18u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_field()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .google.protobuf.DescriptorProto nested_type = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(26u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_nested_type()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .google.protobuf.EnumDescriptorProto enum_type = 4;
      case 4: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(34u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_enum_type()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .google.protobuf.DescriptorProto.ExtensionRange extension_range = 5;
      case 5: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(42u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_extension_range()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .google.protobuf.FieldDescriptorProto extension = 6;
      case 6: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(50u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_extension()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .google.protobuf.MessageOptions options = 7;
      case 7: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(58u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_options()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .google.protobuf.OneofDescriptorProto oneof_decl = 8;
      case 8: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(66u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_oneof_decl()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .google.protobuf.DescriptorProto.ReservedRange reserved_range = 9;
      case 9: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(74u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_reserved_range()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated string reserved_name = 10;
      case 10: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(82u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->add_reserved_name()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->reserved_name(this->reserved_name_size() - 1).data(),
            this->reserved_name(this->reserved_name_size() - 1).length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "google.protobuf.DescriptorProto.reserved_name");
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:google.protobuf.DescriptorProto)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:google.protobuf.DescriptorProto)
  return false;
#undef DO_
}